

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_header_chop_u32(nng_msg *msg,uint32_t *val)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  
  sVar3 = nni_msg_header_len(msg);
  if (sVar3 < 4) {
    iVar2 = 3;
  }
  else {
    pvVar4 = nni_msg_header(msg);
    sVar3 = nni_msg_header_len(msg);
    uVar1 = *(uint *)((long)pvVar4 + (sVar3 - 4));
    *val = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    nni_msg_header_chop(msg,4);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_header_chop_u32(nng_msg *msg, uint32_t *val)
{
	uint8_t *header;
	uint32_t v;
	if (nng_msg_header_len(msg) < sizeof(*val)) {
		return (NNG_EINVAL);
	}
	header = nng_msg_header(msg);
	header += nng_msg_header_len(msg);
	header -= sizeof(v);
	NNI_GET32(header, v);
	*val = v;
	nni_msg_header_chop(msg, sizeof(v));
	return (0);
}